

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O0

void __thiscall QtMWidgets::TableViewCellLayout::setGeometry(TableViewCellLayout *this)

{
  QRect *in_RSI;
  
  setGeometry((TableViewCellLayout *)&this[-1].detailedTextLabel,in_RSI);
  return;
}

Assistant:

void
TableViewCellLayout::setGeometry( const QRect & rect )
{
	QLayout::setGeometry( rect );

	const QMargins m = contentsMargins();
	const QRect r = rect.adjusted( m.left(), m.top(), -m.right(), -m.bottom() );

	int imageOffset = 0;

	const QSize accessorySizeHint = accessoryWidget->sizeHint();

	if( imageLabel->pixmap( Qt::ReturnByValue ).isNull() || !imageLabel->text().isEmpty() )
	{
		if( accessorySizeHint.isEmpty() && textLabel->text().isEmpty() &&
			detailedTextLabel->text().isEmpty() )
		{
			imageLabel->setGeometry( r );
			textLabel->setGeometry( r.x(), r.y(), 0, 0 );
			detailedTextLabel->setGeometry( r.x(), r.y(), 0, 0 );
			accessoryWidget->setGeometry( r.x(), r.y(), 0, 0 );

			return;
		}

		const QSize imageSize = imageLabel->sizeHint();

		imageLabel->setGeometry( r.x(), r.y(),
			imageSize.width(), imageSize.height() );

		imageOffset += imageSize.width() + spacing();
	}
	else
		imageLabel->setGeometry( r.x(), r.y(), 0, 0 );

	if( accessorySizeHint.isEmpty() )
	{
		accessoryWidget->setGeometry( r.x(), r.y(), 0, 0 );

		setTextGeometry( r, imageOffset, 0 );
	}
	else if( textLabel->text().isEmpty() && detailedTextLabel->text().isEmpty() &&
		!accessorySizeHint.isEmpty() )
	{
		textLabel->setGeometry( r.x(), r.y(), 0, 0 );
		detailedTextLabel->setGeometry( r.x(), r.y(), 0, 0 );

		const int offset = ( accessorySizeHint.height() < r.height() ?
			( r.height() - accessorySizeHint.height() ) / 2 : 0 );

		accessoryWidget->setGeometry( r.x() + imageOffset, r.y() + offset,
			r.width() - imageOffset, r.height() - offset * 2 );
	}
	else if( ( !textLabel->text().isEmpty() || !detailedTextLabel->text().isEmpty() ) &&
		!accessorySizeHint.isEmpty() )
	{
		const int offset = ( accessorySizeHint.height() < r.height() ?
			( r.height() - accessorySizeHint.height() ) / 2 : 0 );

		accessoryWidget->setGeometry( r.x() + r.width() -
			accessorySizeHint.width(), r.y() + offset,
			accessorySizeHint.width(), r.height() - offset * 2 );

		setTextGeometry( r, imageOffset, accessorySizeHint.width() );
	}
	else
	{
		textLabel->setGeometry( r.x(), r.y(), 0, 0 );
		detailedTextLabel->setGeometry( r.x(), r.y(), 0, 0 );
		accessoryWidget->setGeometry( r.x(), r.y(), 0, 0 );
	}
}